

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_test.c
# Opt level: O2

bool_t decTest(void)

{
  char cVar1;
  int iVar2;
  u32 uVar3;
  bool_t bVar4;
  u64 uVar5;
  uint uVar6;
  char dec [21];
  uint uVar7;
  
  decFromU32(dec,10,0xffffffff);
  iVar2 = strCmp(dec,"4294967295");
  uVar6 = 0;
  uVar7 = 0;
  if (iVar2 == 0) {
    uVar3 = decToU32(dec);
    if (uVar3 == 0xffffffff) {
      decFromU64(dec,0x14,0xffffffffffffffff);
      iVar2 = strCmp(dec,"18446744073709551615");
      if (iVar2 == 0) {
        uVar5 = decToU64(dec);
        uVar6 = uVar7;
        if (uVar5 == 0xffffffffffffffff) {
          cVar1 = decLuhnCalc("7992739871");
          if (cVar1 == '3') {
            bVar4 = decLuhnVerify("79927398713");
            if (bVar4 != 0) {
              bVar4 = decLuhnVerify("69927398713");
              if (bVar4 == 0) {
                cVar1 = decDammCalc("572");
                if (cVar1 == '4') {
                  bVar4 = decDammVerify("5724");
                  if (bVar4 != 0) {
                    bVar4 = decDammVerify("5274");
                    uVar6 = (uint)(bVar4 == 0);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return uVar6;
}

Assistant:

bool_t decTest()
{
	char dec[21];
	// u32
	decFromU32(dec, 10, U32_MAX);
	if (!strEq(dec, "4294967295") ||
		decToU32(dec) != U32_MAX)
		return FALSE;
#ifdef U64_SUPPORT
	// u64
	decFromU64(dec, 20, U64_MAX);
	if (!strEq(dec, "18446744073709551615") ||
		decToU64(dec) != U64_MAX)
		return FALSE;
#endif
	// check digits
	if (decLuhnCalc("7992739871") != '3' ||
		!decLuhnVerify("79927398713") ||
		decLuhnVerify("69927398713") ||
		decDammCalc("572") != '4' ||
		!decDammVerify("5724") ||
		decDammVerify("5274"))
		return FALSE;
	// все нормально
	return TRUE;
}